

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

DdNode * Llb_ManComputeImage(Llb_Man_t *p,DdNode *bInit,int fBackward)

{
  Llb_Grp_t *pGroup;
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *n;
  int iVar3;
  int iGrpPlace;
  int iVar4;
  int iGrpPlace_00;
  DdManager *table;
  int iVar5;
  
  Cudd_Ref(bInit);
  iGrpPlace_00 = 1;
  iVar4 = -2;
  while( true ) {
    iVar5 = p->pMatrix->nCols;
    if (iVar5 + -1 <= iGrpPlace_00) {
      Cudd_Deref(bInit);
      return bInit;
    }
    iVar5 = iVar5 + iVar4;
    iVar3 = iVar5;
    if (fBackward == 0) {
      iVar3 = iGrpPlace_00;
    }
    pGroup = p->pMatrix->pColGrps[iVar3];
    pDVar1 = Llb_ManConstructGroupBdd(p,pGroup);
    if (pDVar1 == (DdNode *)0x0) break;
    Cudd_Ref(pDVar1);
    pDVar2 = Llb_ManConstructQuantCubeIntern(p,pGroup,iGrpPlace,fBackward);
    Cudd_Ref(pDVar2);
    n = Cudd_bddExistAbstract(p->dd,pDVar1,pDVar2);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->dd,pDVar1);
      table = p->dd;
      bInit = pDVar2;
      goto LAB_006927ed;
    }
    Cudd_Ref(n);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    Cudd_RecursiveDeref(p->dd,pDVar2);
    if (fBackward == 0) {
      pDVar1 = Llb_ManConstructQuantCubeFwd(p,pGroup,iGrpPlace_00);
    }
    else {
      pDVar1 = Llb_ManConstructQuantCubeBwd(p,pGroup,iVar5);
    }
    Cudd_Ref(pDVar1);
    pDVar2 = Cudd_bddAndAbstract(p->dd,bInit,n,pDVar1);
    if (pDVar2 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->dd,bInit);
      Cudd_RecursiveDeref(p->dd,n);
      table = p->dd;
      bInit = pDVar1;
      goto LAB_006927ed;
    }
    Cudd_Ref(pDVar2);
    Cudd_RecursiveDeref(p->dd,bInit);
    Cudd_RecursiveDeref(p->dd,n);
    Cudd_RecursiveDeref(p->dd,pDVar1);
    iGrpPlace_00 = iGrpPlace_00 + 1;
    iVar4 = iVar4 + -1;
    bInit = pDVar2;
  }
  table = p->dd;
LAB_006927ed:
  Cudd_RecursiveDeref(table,bInit);
  return (DdNode *)0x0;
}

Assistant:

DdNode * Llb_ManComputeImage( Llb_Man_t * p, DdNode * bInit, int fBackward )
{
    int fCheckSupport = 0;
    Llb_Grp_t * pGroup;
    DdNode * bImage, * bGroup, * bCube, * bTemp;
    int k, Index;
    bImage = bInit;  Cudd_Ref( bImage );
    for ( k = 1; k < p->pMatrix->nCols-1; k++ )
    {
        if ( fBackward )
            Index = p->pMatrix->nCols - 1 - k;
        else
            Index = k;

        // compute group BDD
        pGroup = p->pMatrix->pColGrps[Index];
        bGroup = Llb_ManConstructGroupBdd( p, pGroup );
        if ( bGroup == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bImage );
            return NULL;
        }
        Cudd_Ref( bGroup );
        // quantify variables appearing only in this group
        bCube  = Llb_ManConstructQuantCubeIntern( p, pGroup, Index, fBackward );       Cudd_Ref( bCube );
        bGroup = Cudd_bddExistAbstract( p->dd, bTemp = bGroup, bCube );         
        if ( bGroup == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bCube );
            return NULL;
        }
        Cudd_Ref( bGroup );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );
        // perform partial product
        if ( fBackward )
            bCube  = Llb_ManConstructQuantCubeBwd( p, pGroup, Index );
        else
            bCube  = Llb_ManConstructQuantCubeFwd( p, pGroup, Index );
        Cudd_Ref( bCube );
//        bImage = Extra_bddAndAbstractTime( p->dd, bTemp = bImage, bGroup, bCube, p->pPars->TimeTarget );   
        bImage = Cudd_bddAndAbstract( p->dd, bTemp = bImage, bGroup, bCube );   
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( p->dd, bTemp );
            Cudd_RecursiveDeref( p->dd, bGroup );
            Cudd_RecursiveDeref( p->dd, bCube );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bGroup );
        Cudd_RecursiveDeref( p->dd, bCube );
    }

    // make sure image depends on next state vars
    if ( fCheckSupport )
    {
        bCube = Cudd_Support( p->dd, bImage );    Cudd_Ref( bCube );
        for ( bTemp = bCube; bTemp != p->dd->one; bTemp = cuddT(bTemp) )
        {
            int ObjId = Vec_IntEntry( p->vVar2Obj, bTemp->index );
            Aig_Obj_t * pObj = Aig_ManObj( p->pAig, ObjId );
            if ( !Saig_ObjIsLi(p->pAig, pObj) )
                printf( "Var %d assigned to obj %d that is not LI\n", bTemp->index, ObjId );
        }
        Cudd_RecursiveDeref( p->dd, bCube );
    }
    Cudd_Deref( bImage );
    return bImage;
}